

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void store_pc_exc_ret(DisasContext_conflict1 *s,TCGv_i32 pc)

{
  uintptr_t o;
  uintptr_t o_1;
  
  if ((TCGv_i32)s[0x81].tmp_a64[10] != pc) {
    tcg_gen_op2_aarch64((TCGContext_conflict1 *)s,INDEX_op_mov_i32,
                        (TCGArg)((TCGv_i32)s[0x81].tmp_a64[10] + (long)s),
                        (TCGArg)(pc + (long)&s->base));
  }
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)s,(TCGTemp *)(pc + (long)s));
  return;
}

Assistant:

static void store_pc_exc_ret(DisasContext *s, TCGv_i32 pc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_R[15], pc);
    tcg_temp_free_i32(tcg_ctx, pc);
}